

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O1

size_t fiobj_str_write_i(FIOBJ dest,int64_t num)

{
  fio_str_s_conflict *s;
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  char buf [22];
  fio_str_info_s local_50;
  char local_38 [24];
  
  if (((uint)dest & 7) != 2) {
    __assert_fail("FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_str.c"
                  ,0x103,"size_t fiobj_str_write_i(FIOBJ, int64_t)");
  }
  uVar5 = dest & 0xfffffffffffffff8;
  if (*(char *)(uVar5 + 0x11) != '\0') {
    return 0;
  }
  s = (fio_str_s_conflict *)(uVar5 + 0x10);
  *(undefined8 *)(uVar5 + 8) = 0;
  if (*(char *)(uVar5 + 0x11) != '\0') {
    if ((s->small == 0) && (*(long *)(uVar5 + 0x38) != 0)) {
      return *(size_t *)(uVar5 + 0x28);
    }
    return (ulong)(s->small >> 1);
  }
  if (num == 0) {
    bVar1 = s->small;
    if ((bVar1 == 0) && (*(long *)(uVar5 + 0x38) != 0)) {
      uVar8 = *(ulong *)(uVar5 + 0x28);
    }
    else {
      uVar8 = (ulong)(bVar1 >> 1);
    }
    uVar8 = uVar8 + 1;
    if ((bVar1 == 0) && (*(long *)(uVar5 + 0x38) != 0)) {
      uVar4 = *(ulong *)(uVar5 + 0x20);
      if (uVar4 <= uVar8) {
        if (*(long *)(uVar5 + 0x30) == 0) {
          uVar4 = *(ulong *)(uVar5 + 0x28);
        }
        *(ulong *)(uVar5 + 0x28) = uVar4;
        goto LAB_0014419f;
      }
    }
    else {
      if (uVar8 < 0x2e) {
        *(char *)(uVar5 + 0x10) = (char)uVar8 * '\x02' + '\x01';
        *(undefined1 *)(uVar5 + 0x12 + uVar8) = 0;
        lVar9 = uVar5 + 0x12;
        goto LAB_001441bd;
      }
      s->small = '[';
LAB_0014419f:
      fio_str_capa_assert(&local_50,s,uVar8);
    }
    *(ulong *)(uVar5 + 0x28) = uVar8;
    *(undefined1 *)(*(long *)(uVar5 + 0x38) + uVar8) = 0;
    lVar9 = *(long *)(uVar5 + 0x38);
LAB_001441bd:
    *(undefined1 *)(lVar9 + -1 + uVar8) = 0x30;
    return uVar8;
  }
  uVar8 = -num;
  if (0 < num) {
    uVar8 = num;
  }
  lVar9 = 0;
  do {
    lVar6 = lVar9;
    local_38[lVar6] = (char)(uVar8 / 10) * -10 + (char)uVar8 + '0';
    lVar9 = lVar6 + 1;
    bVar2 = 9 < uVar8;
    uVar8 = uVar8 / 10;
  } while (bVar2);
  if (num < 0) {
    local_38[lVar6 + 1] = '-';
    lVar9 = lVar6 + 2;
  }
  bVar1 = s->small;
  if ((bVar1 == 0) && (*(long *)(uVar5 + 0x38) != 0)) {
    uVar8 = *(ulong *)(uVar5 + 0x28);
  }
  else {
    uVar8 = (ulong)(bVar1 >> 1);
  }
  uVar4 = uVar8 + lVar9;
  if ((bVar1 == 0) && (*(long *)(uVar5 + 0x38) != 0)) {
    uVar3 = *(ulong *)(uVar5 + 0x20);
    if (uVar3 <= uVar4) {
      if (*(long *)(uVar5 + 0x30) == 0) {
        uVar3 = *(ulong *)(uVar5 + 0x28);
      }
      *(ulong *)(uVar5 + 0x28) = uVar3;
      goto LAB_0014410e;
    }
  }
  else {
    if (uVar4 < 0x2e) {
      *(char *)(uVar5 + 0x10) = (char)uVar4 * '\x02' + '\x01';
      *(undefined1 *)(uVar5 + 0x12 + uVar4) = 0;
      lVar6 = uVar5 + 0x12;
      goto LAB_0014412c;
    }
    s->small = '[';
LAB_0014410e:
    fio_str_capa_assert(&local_50,s,uVar4);
  }
  *(ulong *)(uVar5 + 0x28) = uVar4;
  *(undefined1 *)(*(long *)(uVar5 + 0x38) + uVar4) = 0;
  lVar6 = *(long *)(uVar5 + 0x38);
LAB_0014412c:
  if (lVar9 != 0) {
    pcVar7 = (char *)(lVar6 + uVar8);
    do {
      *pcVar7 = local_38[lVar9 + -1];
      pcVar7 = pcVar7 + 1;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  return uVar4;
}

Assistant:

size_t fiobj_str_write_i(FIOBJ dest, int64_t num) {
  assert(FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING));
  if (obj2str(dest)->str.frozen)
    return 0;
  obj2str(dest)->hash = 0;
  return fio_str_write_i(&obj2str(dest)->str, num).len;
}